

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O3

API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
::addMultiArgWithFlagOnly
          (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,Char flag,bool isWithValue,bool isRequired,String *desc,String *longDesc,
          String *defaultValue,String *valueSpecifier)

{
  Arg *this_00;
  
  this_00 = (Arg *)operator_new(0x130);
  Arg::Arg(this_00,flag,isWithValue,isRequired);
  (this_00->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__MultiArg_00171220;
  this_00[1].super_ArgIface._vptr_ArgIface = (_func_int **)0x0;
  this_00[1].super_ArgIface.m_cmdLine = (CmdLine *)0x0;
  this_00[1].m_isWithValue = false;
  this_00[1].m_isRequired = false;
  this_00[1].m_isDefined = false;
  *(undefined5 *)&this_00[1].field_0x13 = 0;
  this_00[1].m_value._M_dataplus._M_p = (pointer)0x0;
  this_00[1].m_value._M_string_length = 0;
  this_00[1].m_value.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[1].m_value.field_2 + 8) = 0;
  if (desc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_description);
  }
  if (longDesc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_longDescription);
  }
  if (defaultValue->_M_string_length != 0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[0x16])(this_00);
  }
  if (valueSpecifier->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_valueSpecifier);
  }
  (*(this->m_self->super_GroupIface).super_ArgIface._vptr_ArgIface[0x13])();
  if (this_00 != (Arg *)0x0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[1])();
  }
  return this;
}

Assistant:

API< PARENT, Command, ARGPTR, false > & addMultiArgWithFlagOnly(
		//! Flag for this argument.
		Char flag,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< MultiArg, details::Deleter< ArgIface > > (
			new MultiArg( flag, isWithValue, isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}